

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O0

bool __thiscall
ON_Layer::CopyPerViewportSettings
          (ON_Layer *this,ON_Layer *source_layer,ON_UUID viewport_id,uint settings_mask)

{
  bool bVar1;
  int iVar2;
  ON__LayerExtensions *pOVar3;
  ON__LayerPerViewSettings *pOVar4;
  ON__LayerPerViewSettings *pOVar5;
  undefined1 in_R9B;
  ON_UUID viewport_id_00;
  ON_UUID viewport_id_01;
  ON_UUID viewport_id_02;
  ON__LayerPerViewSettings *dst_1;
  ON__LayerPerViewSettings *src_1;
  ON__LayerPerViewSettings *dst;
  ON__LayerPerViewSettings *src;
  int i;
  int count;
  ON__LayerExtensions *soruce_layer_ud;
  bool rc;
  uint settings_mask_local;
  ON_Layer *source_layer_local;
  ON_Layer *this_local;
  ON_UUID viewport_id_local;
  
  viewport_id_local._0_8_ = viewport_id.Data4;
  this_local = viewport_id._0_8_;
  soruce_layer_ud._3_1_ = false;
  if ((settings_mask != 0) && (this != source_layer)) {
    bVar1 = ON_UuidIsNil((ON_UUID *)&this_local);
    if (bVar1) {
      pOVar3 = ON__LayerExtensions::LayerExtensions
                         (source_layer,&source_layer->m_extension_bits,false);
      if (pOVar3 != (ON__LayerExtensions *)0x0) {
        iVar2 = ON_SimpleArray<ON__LayerPerViewSettings>::Count(&pOVar3->m_vp_settings);
        for (src._0_4_ = 0; (int)src < iVar2; src._0_4_ = (int)src + 1) {
          pOVar4 = ON_SimpleArray<ON__LayerPerViewSettings>::operator[]
                             (&pOVar3->m_vp_settings,(int)src);
          viewport_id_00.Data4[0] = '\x01';
          viewport_id_00.Data4[1] = '\0';
          viewport_id_00.Data4[2] = '\0';
          viewport_id_00.Data4[3] = '\0';
          viewport_id_00.Data4[4] = '\0';
          viewport_id_00.Data4[5] = '\0';
          viewport_id_00.Data4[6] = '\0';
          viewport_id_00.Data4[7] = '\0';
          viewport_id_00._0_8_ = *(undefined8 *)(pOVar4->m_viewport_id).Data4;
          pOVar5 = ON__LayerExtensions::ViewportSettings
                             ((ON__LayerExtensions *)this,(ON_Layer *)&this->m_extension_bits,
                              *(uchar **)&pOVar4->m_viewport_id,viewport_id_00,(bool)in_R9B);
          if (pOVar5 != (ON__LayerPerViewSettings *)0x0) {
            ON__LayerPerViewSettings::CopySettings(pOVar5,pOVar4,settings_mask);
            soruce_layer_ud._3_1_ = true;
          }
        }
      }
    }
    else {
      viewport_id_01.Data4[0] = '\0';
      viewport_id_01.Data4[1] = '\0';
      viewport_id_01.Data4[2] = '\0';
      viewport_id_01.Data4[3] = '\0';
      viewport_id_01.Data4[4] = '\0';
      viewport_id_01.Data4[5] = '\0';
      viewport_id_01.Data4[6] = '\0';
      viewport_id_01.Data4[7] = '\0';
      viewport_id_01.Data1 = viewport_id_local.Data1;
      viewport_id_01.Data2 = viewport_id_local.Data2;
      viewport_id_01.Data3 = viewport_id_local.Data3;
      pOVar4 = ON__LayerExtensions::ViewportSettings
                         ((ON__LayerExtensions *)source_layer,
                          (ON_Layer *)&source_layer->m_extension_bits,(uchar *)this_local,
                          viewport_id_01,(bool)in_R9B);
      if (pOVar4 != (ON__LayerPerViewSettings *)0x0) {
        viewport_id_02.Data4[0] = '\x01';
        viewport_id_02.Data4[1] = '\0';
        viewport_id_02.Data4[2] = '\0';
        viewport_id_02.Data4[3] = '\0';
        viewport_id_02.Data4[4] = '\0';
        viewport_id_02.Data4[5] = '\0';
        viewport_id_02.Data4[6] = '\0';
        viewport_id_02.Data4[7] = '\0';
        viewport_id_02.Data1 = viewport_id_local.Data1;
        viewport_id_02.Data2 = viewport_id_local.Data2;
        viewport_id_02.Data3 = viewport_id_local.Data3;
        pOVar5 = ON__LayerExtensions::ViewportSettings
                           ((ON__LayerExtensions *)this,(ON_Layer *)&this->m_extension_bits,
                            (uchar *)this_local,viewport_id_02,(bool)in_R9B);
        soruce_layer_ud._3_1_ = pOVar5 != (ON__LayerPerViewSettings *)0x0;
        if (soruce_layer_ud._3_1_) {
          ON__LayerPerViewSettings::CopySettings(pOVar5,pOVar4,settings_mask);
        }
      }
    }
  }
  return soruce_layer_ud._3_1_;
}

Assistant:

bool ON_Layer::CopyPerViewportSettings( 
    const ON_Layer& source_layer,
    ON_UUID viewport_id,
    unsigned int settings_mask
    )
{
  bool rc = false;
  if ( 0 != settings_mask && this != &source_layer )
  {
    if ( ON_UuidIsNil(viewport_id) )
    {
      // copy per viewport settings for every viewport
      const ON__LayerExtensions* soruce_layer_ud = ON__LayerExtensions::LayerExtensions(source_layer,&source_layer.m_extension_bits,false);
      if ( 0 != soruce_layer_ud )
      {
        const int count = soruce_layer_ud->m_vp_settings.Count();
        for ( int i = 0; i < count; i++ )
        {
          const ON__LayerPerViewSettings& src = soruce_layer_ud->m_vp_settings[i];
          ON__LayerPerViewSettings* dst = ON__LayerExtensions::ViewportSettings( *this, &m_extension_bits, src.m_viewport_id, true);
          if ( 0 != dst )
          {
            dst->CopySettings(&src,settings_mask);
            rc = true;
          }
        }
      }
    }
    else
    {
      // copy per viewport settings for a specified viewport.
      const ON__LayerPerViewSettings* src = ON__LayerExtensions::ViewportSettings( source_layer, &source_layer.m_extension_bits, viewport_id, false);
      if ( 0 != src )
      {
        ON__LayerPerViewSettings* dst = ON__LayerExtensions::ViewportSettings( *this, &m_extension_bits, viewport_id, true);
        if ( 0 != dst )
        {
          dst->CopySettings(src,settings_mask);
          rc = true;
        }
      }
    }
  }
  return rc;
}